

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O3

void google::protobuf::util::anon_unknown_0::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int32_t iVar4;
  uint32_t uVar5;
  Any *this;
  Message *message;
  uint64_t uVar6;
  EnumValueDescriptor *pEVar7;
  size_type sVar8;
  byte bVar9;
  Arena *pAVar10;
  Arena *extraout_RDX;
  _Alloc_hider _Var11;
  ArenaStringPtr *this_00;
  float fVar12;
  Int32Value wrapper;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  double local_98;
  undefined1 local_90 [32];
  string local_70;
  undefined1 local_50 [32];
  
  pAVar10 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar10 & 1) != 0) {
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(out->field_0)._impl_.name_,
             (string *)
             ((long)&(field->all_names_->_M_dataplus)._M_p +
             (ulong)(((byte)field->field_0x1 & 8) << 2)),pAVar10);
  *(byte *)&out->field_0 = *(byte *)&out->field_0 | 1;
  this = (out->field_0)._impl_.value_;
  if (this == (Any *)0x0) {
    pAVar10 = (Arena *)(out->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    this = (Any *)Arena::DefaultConstruct<google::protobuf::Any>(pAVar10);
    (out->field_0)._impl_.value_ = this;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        iVar4 = Reflection::GetInt32(reflection,options,field);
      }
      else {
        iVar4 = Reflection::GetRepeatedInt32(reflection,options,field,index);
      }
      Int32Value::Int32Value((Int32Value *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity._0_4_ = iVar4;
      Any::PackFrom(this,(Message *)local_b8);
LAB_00323240:
      Int32Value::~Int32Value((Int32Value *)local_b8);
      return;
    }
    goto LAB_00323484;
  case 2:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        sVar8 = Reflection::GetInt64(reflection,options,field);
      }
      else {
        sVar8 = Reflection::GetRepeatedInt64(reflection,options,field,index);
      }
      Int64Value::Int64Value((Int64Value *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity = sVar8;
      Any::PackFrom(this,(Message *)local_b8);
      Int64Value::~Int64Value((Int64Value *)local_b8);
      return;
    }
    goto LAB_00323499;
  case 3:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        uVar5 = Reflection::GetUInt32(reflection,options,field);
      }
      else {
        uVar5 = Reflection::GetRepeatedUInt32(reflection,options,field,index);
      }
      UInt32Value::UInt32Value((UInt32Value *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity._0_4_ = uVar5;
      Any::PackFrom(this,(Message *)local_b8);
      UInt32Value::~UInt32Value((UInt32Value *)local_b8);
      return;
    }
    goto LAB_00323447;
  case 4:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        uVar6 = Reflection::GetUInt64(reflection,options,field);
      }
      else {
        uVar6 = Reflection::GetRepeatedUInt64(reflection,options,field,index);
      }
      UInt64Value::UInt64Value((UInt64Value *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity = uVar6;
      Any::PackFrom(this,(Message *)local_b8);
      UInt64Value::~UInt64Value((UInt64Value *)local_b8);
      return;
    }
    goto LAB_0032345c;
  case 5:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        local_98 = Reflection::GetDouble(reflection,options,field);
      }
      else {
        local_98 = Reflection::GetRepeatedDouble(reflection,options,field,index);
      }
      DoubleValue::DoubleValue((DoubleValue *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity = (size_type)local_98;
      Any::PackFrom(this,(Message *)local_b8);
      DoubleValue::~DoubleValue((DoubleValue *)local_b8);
      return;
    }
    _GLOBAL__N_1::ConvertOptionField();
    break;
  case 6:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        fVar12 = Reflection::GetFloat(reflection,options,field);
      }
      else {
        fVar12 = Reflection::GetRepeatedFloat(reflection,options,field,index);
      }
      local_98 = (double)CONCAT44(local_98._4_4_,fVar12);
      FloatValue::FloatValue((FloatValue *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity._0_4_ = local_98._0_4_;
      Any::PackFrom(this,(Message *)local_b8);
      FloatValue::~FloatValue((FloatValue *)local_b8);
      return;
    }
    goto LAB_003234ae;
  case 7:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        bVar3 = Reflection::GetBool(reflection,options,field);
      }
      else {
        bVar3 = Reflection::GetRepeatedBool(reflection,options,field,index);
      }
      BoolValue::BoolValue((BoolValue *)local_b8,(Arena *)0x0);
      local_a8._M_local_buf[0] = bVar3;
      Any::PackFrom(this,(Message *)local_b8);
      BoolValue::~BoolValue((BoolValue *)local_b8);
      return;
    }
    goto LAB_003234c3;
  case 8:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        pEVar7 = Reflection::GetEnum(reflection,options,field);
      }
      else {
        pEVar7 = Reflection::GetRepeatedEnum(reflection,options,field,index);
      }
      iVar2 = pEVar7->number_;
      Int32Value::Int32Value((Int32Value *)local_b8,(Arena *)0x0);
      local_a8._M_allocated_capacity._0_4_ = iVar2;
      Any::PackFrom(this,(Message *)local_b8);
      goto LAB_00323240;
    }
    goto LAB_00323471;
  case 9:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 != (bool)bVar9) goto LAB_003234d8;
    if ((bVar1 & 0x20) == 0) {
      Reflection::GetString_abi_cxx11_((string *)local_b8,reflection,options,field);
    }
    else {
      Reflection::GetRepeatedString_abi_cxx11_((string *)local_b8,reflection,options,field,index);
    }
    if (field->type_ == '\t') {
      field = (FieldDescriptor *)(local_50 + 0x10);
      local_50._0_8_ = field;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,local_b8._0_8_,(char *)(local_b8._0_8_ + local_b8._8_8_));
      StringValue::StringValue((StringValue *)local_90,(Arena *)0x0);
      this_00 = (ArenaStringPtr *)(local_90 + 0x10);
      if ((local_90._8_8_ & 1) != 0) goto LAB_003234ed;
      goto LAB_00323333;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_b8._0_8_,(char *)(local_b8._0_8_ + local_b8._8_8_));
    BytesValue::BytesValue((BytesValue *)local_90,(Arena *)0x0);
    if ((local_90._8_8_ & 1) != 0) {
      local_90._8_8_ = *(undefined8 *)(local_90._8_8_ & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(local_90 + 0x10),&local_70,(Arena *)local_90._8_8_);
    Any::PackFrom(this,(Message *)local_90);
    BytesValue::~BytesValue((BytesValue *)local_90);
    _Var11._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_003233d2;
    goto LAB_003233da;
  case 10:
    bVar1 = field->field_0x1;
    bVar9 = (bVar1 & 0x20) >> 5;
    if (0xbf < bVar1 == (bool)bVar9) {
      if ((bVar1 & 0x20) == 0) {
        message = Reflection::GetMessage(reflection,options,field,(MessageFactory *)0x0);
      }
      else {
        message = Reflection::GetRepeatedMessage(reflection,options,field,index);
      }
      Any::PackFrom(this,message);
      return;
    }
    break;
  default:
    goto switchD_00322f15_default;
  }
  _GLOBAL__N_1::ConvertOptionField();
LAB_00323447:
  _GLOBAL__N_1::ConvertOptionField();
LAB_0032345c:
  _GLOBAL__N_1::ConvertOptionField();
LAB_00323471:
  _GLOBAL__N_1::ConvertOptionField();
LAB_00323484:
  _GLOBAL__N_1::ConvertOptionField();
LAB_00323499:
  _GLOBAL__N_1::ConvertOptionField();
LAB_003234ae:
  _GLOBAL__N_1::ConvertOptionField();
LAB_003234c3:
  _GLOBAL__N_1::ConvertOptionField();
LAB_003234d8:
  this_00 = (ArenaStringPtr *)(ulong)bVar9;
  _GLOBAL__N_1::ConvertOptionField();
  local_90._8_8_ = extraout_RDX;
LAB_003234ed:
  local_90._8_8_ = *(undefined8 *)(local_90._8_8_ & 0xfffffffffffffffe);
LAB_00323333:
  internal::ArenaStringPtr::Set<>(this_00,(string *)local_50,(Arena *)local_90._8_8_);
  Any::PackFrom(this,(Message *)local_90);
  StringValue::~StringValue((StringValue *)local_90);
  local_70.field_2._M_allocated_capacity = local_50._16_8_;
  _Var11._M_p = (pointer)local_50._0_8_;
  if ((FieldDescriptor *)local_50._0_8_ != field) {
LAB_003233d2:
    operator_delete(_Var11._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_003233da:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ != &local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
  }
switchD_00322f15_default:
  return;
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}